

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

PropertyId __thiscall
IRBuilderAsmJs::CalculatePropertyOffset(IRBuilderAsmJs *this,RegSlot regSlot,IRType type)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  undefined1 local_38 [4];
  uint32 bytecodeRegSlot;
  TypedSlotInfo typedInfo;
  Types asmType;
  size_t localsOffset;
  IRType type_local;
  RegSlot regSlot_local;
  IRBuilderAsmJs *this_local;
  
  uVar3 = Js::InterpreterStackFrame::GetOffsetOfLocals();
  register0x00000000 = (ulong)uVar3;
  if ((uVar3 & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xe65,"(localsOffset % sizeof(AsmJsSIMDValue) == 0)",
                       "localsOffset % sizeof(AsmJsSIMDValue) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  typedInfo.byteOffset = WAsmJs::FromIRType(type);
  AsmJsJITInfo::GetTypedSlotInfo((TypedSlotInfo *)local_38,this->m_asmFuncInfo,typedInfo.byteOffset)
  ;
  uVar3 = GetTypedRegFromRegSlot(this,regSlot,typedInfo.byteOffset);
  return uVar3 * TySize[type] + typedInfo.varCount + (int)stack0xffffffffffffffe0;
}

Assistant:

Js::PropertyId IRBuilderAsmJs::CalculatePropertyOffset(Js::RegSlot regSlot, IRType type)
{
    // Compute the offset to the start of the interpreter frame's locals array as a Var index.
    size_t localsOffset = Js::InterpreterStackFrame::GetOffsetOfLocals();
    Assert(localsOffset % sizeof(AsmJsSIMDValue) == 0);
    WAsmJs::Types asmType = WAsmJs::FromIRType(type);
    const auto typedInfo = m_asmFuncInfo->GetTypedSlotInfo(asmType);
    uint32 bytecodeRegSlot = GetTypedRegFromRegSlot(regSlot, asmType);
    return (Js::PropertyId)(bytecodeRegSlot * TySize[type] + typedInfo.byteOffset + localsOffset);
}